

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O1

bool __thiscall
ddd::DaTrie<true,_true,_false>::is_target_(DaTrie<true,_true,_false> *this,uint32_t base,Edge *edge)

{
  uint8_t *puVar1;
  pointer pBVar2;
  size_t sVar3;
  bool bVar4;
  
  if (edge->size_ == 0) {
    __assert_fail("0 < edge.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/include/DaTrie.hpp"
                  ,0x3b7,
                  "bool ddd::DaTrie<true, true, false>::is_target_(uint32_t, const Edge &) const [WithBLM = true, WithNLM = true, Prefix = false]"
                 );
  }
  pBVar2 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)pBVar2[edge->labels_[0] ^ base] < 0) {
    bVar4 = false;
  }
  else {
    sVar3 = 1;
    do {
      bVar4 = edge->size_ == sVar3;
      if (bVar4) {
        return bVar4;
      }
      puVar1 = edge->labels_ + sVar3;
      sVar3 = sVar3 + 1;
    } while (-1 < (long)pBVar2[*puVar1 ^ base]);
  }
  return bVar4;
}

Assistant:

bool is_target_(uint32_t base, const Edge& edge) const {
    assert(0 < edge.size());

    for (auto label : edge) {
      auto child_pos = base ^label;
      if (bc_[child_pos].is_fixed()) {
        return false;
      }
    }
    return true;
  }